

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_mem.c
# Opt level: O0

zt_mem_pool_group * zt_mem_pool_group_init(zt_mem_pool_desc *group,size_t len)

{
  zt_mem_pool_group *pzVar1;
  zt_mem_pool **ppzVar2;
  zt_mem_pool *pzVar3;
  zt_mem_pool **in_RSI;
  long in_RDI;
  bool bVar4;
  size_t i;
  zt_mem_pool_group *ngroup;
  zt_page_release_test in_stack_00000030;
  size_t in_stack_00000038;
  ssize_t in_stack_00000040;
  char *in_stack_00000048;
  size_t in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  
  pzVar1 = (zt_mem_pool_group *)
           zt_calloc_p(CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8);
  if (pzVar1 != (zt_mem_pool_group *)0x0) {
    ppzVar2 = (zt_mem_pool **)
              zt_calloc_p(CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffc8);
    pzVar1->pools = ppzVar2;
    if (ppzVar2 != (zt_mem_pool **)0x0) {
      (pzVar1->group_list).prev = (zt_elist *)pzVar1;
      (pzVar1->group_list).next = (zt_elist *)pzVar1;
      pzVar1->npools = (size_t)in_RSI;
      ppzVar2 = (zt_mem_pool **)0x0;
      while( true ) {
        bVar4 = false;
        if (ppzVar2 < in_RSI) {
          bVar4 = *(long *)(in_RDI + (long)ppzVar2 * 0x30) != 0;
        }
        if (!bVar4) {
          return pzVar1;
        }
        pzVar3 = zt_mem_pool_init(in_stack_00000048,in_stack_00000040,in_stack_00000038,
                                  in_stack_00000030,group,len._4_4_);
        pzVar1->pools[(long)ppzVar2] = pzVar3;
        if (pzVar1->pools[(long)ppzVar2] == (zt_mem_pool *)0x0) break;
        ppzVar2 = (zt_mem_pool **)((long)ppzVar2 + 1);
      }
      while (ppzVar2 = (zt_mem_pool **)((long)ppzVar2 + -1), ppzVar2 != (zt_mem_pool **)0x0) {
        zt_mem_pool_destroy(ppzVar2);
      }
    }
  }
  return (zt_mem_pool_group *)0x0;
}

Assistant:

zt_mem_pool_group *
zt_mem_pool_group_init(zt_mem_pool_desc *group, size_t len)
{
    zt_mem_pool_group * ngroup;
    size_t              i;

    if ((ngroup = zt_calloc(zt_mem_pool_group, 1)) == NULL) {
        return 0;
    }

    if ((ngroup->pools = zt_calloc(zt_mem_pool *, len)) == NULL) {
        return 0;
    }
    zt_elist_reset(&ngroup->group_list);
    ngroup->npools = len;

    for (i = 0; i < len && group[i].name; i++) {
        ngroup->pools[i] = zt_mem_pool_init(group[i].name,
                                            group[i].elts,
                                            group[i].size,
                                            group[i].release_test,
                                            group[i].cb_data,
                                            group[i].flags);
        if (!ngroup->pools[i]) {
            while (--i) {
                zt_mem_pool_destroy(&ngroup->pools[i]);
            }
            return 0;
        }
    }

    return ngroup;
}